

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> __thiscall
capnp::compiler::NodeTranslator::BrandScope::setParams
          (BrandScope *this,Array<capnp::compiler::NodeTranslator::BrandedDecl> *params,
          Which genericType,Reader source)

{
  ArrayDisposer *pAVar1;
  undefined8 this_00;
  uint uVar2;
  size_t sVar3;
  BrandedDecl *pBVar4;
  NullableValue<capnp::compiler::Declaration::Which> *other;
  Which *pWVar5;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *params_1;
  short in_CX;
  undefined6 in_register_00000012;
  BrandScope *pBVar6;
  BrandScope *extraout_RDX;
  BrandScope *extraout_RDX_00;
  BrandScope *extraout_RDX_01;
  BrandScope *extraout_RDX_02;
  Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> MVar7;
  Own<capnp::compiler::NodeTranslator::BrandScope> local_c0;
  ArrayPtr<const_char> local_b0 [2];
  undefined1 local_90 [4];
  NullableValue<capnp::compiler::Declaration::Which> local_8c;
  undefined1 auStack_88 [4];
  NullableValue<capnp::compiler::Declaration::Which> kind;
  BrandedDecl *param;
  BrandedDecl *__end6;
  BrandedDecl *__begin6;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *__range6;
  StringPtr local_58;
  StringPtr local_48;
  StringPtr local_38;
  short local_22;
  BrandScope *pBStack_20;
  Which genericType_local;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *params_local;
  BrandScope *this_local;
  
  pBVar6 = (BrandScope *)CONCAT62(in_register_00000012,genericType);
  local_22 = in_CX;
  pBStack_20 = pBVar6;
  params_local = params;
  this_local = this;
  sVar3 = kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::size
                    ((Array<capnp::compiler::NodeTranslator::BrandedDecl> *)&params[2].size_);
  if (sVar3 == 0) {
    sVar3 = kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::size
                      ((Array<capnp::compiler::NodeTranslator::BrandedDecl> *)pBVar6);
    if (*(uint *)&params[2].ptr < sVar3) {
      if (*(int *)&params[2].ptr == 0) {
        pAVar1 = params->disposer;
        kj::StringPtr::StringPtr(&local_48,"Declaration does not accept generic parameters.");
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  ((ErrorReporter *)pAVar1,&source,local_48);
      }
      else {
        pAVar1 = params->disposer;
        kj::StringPtr::StringPtr(&local_58,"Too many generic parameters.");
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  ((ErrorReporter *)pAVar1,&source,local_58);
      }
      kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::Maybe
                ((Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> *)this,(void *)0x0);
      pBVar6 = extraout_RDX_00;
    }
    else {
      sVar3 = kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::size
                        ((Array<capnp::compiler::NodeTranslator::BrandedDecl> *)pBVar6);
      if (sVar3 < *(uint *)&params[2].ptr) {
        pAVar1 = params->disposer;
        kj::StringPtr::StringPtr((StringPtr *)&__range6,"Not enough generic parameters.");
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  ((ErrorReporter *)pAVar1,&source,(StringPtr)___range6);
        kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::Maybe
                  ((Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> *)this,(void *)0x0)
        ;
        pBVar6 = extraout_RDX_01;
      }
      else {
        if (local_22 != 0x1c) {
          __end6 = kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::begin
                             ((Array<capnp::compiler::NodeTranslator::BrandedDecl> *)pBVar6);
          pBVar4 = kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::end
                             ((Array<capnp::compiler::NodeTranslator::BrandedDecl> *)pBVar6);
          for (; __end6 != pBVar4; __end6 = __end6 + 1) {
            _auStack_88 = __end6;
            BrandedDecl::getKind((BrandedDecl *)local_90);
            other = kj::_::readMaybe<capnp::compiler::Declaration::Which>
                              ((Maybe<capnp::compiler::Declaration::Which> *)local_90);
            kj::_::NullableValue<capnp::compiler::Declaration::Which>::NullableValue
                      ((NullableValue<capnp::compiler::Declaration::Which> *)(local_90 + 4),other);
            kj::Maybe<capnp::compiler::Declaration::Which>::~Maybe
                      ((Maybe<capnp::compiler::Declaration::Which> *)local_90);
            pWVar5 = kj::_::NullableValue::operator_cast_to_Which_((NullableValue *)(local_90 + 4));
            if (pWVar5 != (Which *)0x0) {
              pWVar5 = kj::_::NullableValue<capnp::compiler::Declaration::Which>::operator*
                                 ((NullableValue<capnp::compiler::Declaration::Which> *)
                                  (local_90 + 4));
              this_00 = _auStack_88;
              uVar2 = (uint)*pWVar5;
              if ((((uVar2 != 5) && (uVar2 != 9)) && (2 < uVar2 - 0x1a)) && (uVar2 != 0x1e)) {
                pAVar1 = params->disposer;
                kj::StringPtr::StringPtr
                          ((StringPtr *)local_b0,
                           "Sorry, only pointer types can be used as generic parameters.");
                BrandedDecl::addError
                          ((BrandedDecl *)this_00,(ErrorReporter *)pAVar1,(StringPtr)local_b0[0]);
              }
            }
            kj::_::NullableValue<capnp::compiler::Declaration::Which>::~NullableValue
                      ((NullableValue<capnp::compiler::Declaration::Which> *)(local_90 + 4));
          }
        }
        params_1 = kj::mv<kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>>
                             ((Array<capnp::compiler::NodeTranslator::BrandedDecl> *)pBVar6);
        kj::
        refcounted<capnp::compiler::NodeTranslator::BrandScope,capnp::compiler::NodeTranslator::BrandScope&,kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>>
                  ((kj *)&local_c0,(BrandScope *)params,params_1);
        kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::Maybe
                  ((Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> *)this,&local_c0);
        kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own(&local_c0);
        pBVar6 = extraout_RDX_02;
      }
    }
  }
  else {
    pAVar1 = params->disposer;
    kj::StringPtr::StringPtr(&local_38,"Double-application of generic parameters.");
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
              ((ErrorReporter *)pAVar1,&source,local_38);
    kj::Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>::Maybe
              ((Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> *)this,(void *)0x0);
    pBVar6 = extraout_RDX;
  }
  MVar7.ptr.ptr = pBVar6;
  MVar7.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_>)MVar7.ptr;
}

Assistant:

kj::Maybe<kj::Own<BrandScope>> setParams(
      kj::Array<BrandedDecl> params, Declaration::Which genericType, Expression::Reader source) {
    if (this->params.size() != 0) {
      errorReporter.addErrorOn(source, "Double-application of generic parameters.");
      return nullptr;
    } else if (params.size() > leafParamCount) {
      if (leafParamCount == 0) {
        errorReporter.addErrorOn(source, "Declaration does not accept generic parameters.");
      } else {
        errorReporter.addErrorOn(source, "Too many generic parameters.");
      }
      return nullptr;
    } else if (params.size() < leafParamCount) {
      errorReporter.addErrorOn(source, "Not enough generic parameters.");
      return nullptr;
    } else {
      if (genericType != Declaration::BUILTIN_LIST) {
        for (auto& param: params) {
          KJ_IF_MAYBE(kind, param.getKind()) {
            switch (*kind) {
              case Declaration::BUILTIN_LIST:
              case Declaration::BUILTIN_TEXT:
              case Declaration::BUILTIN_DATA:
              case Declaration::BUILTIN_ANY_POINTER:
              case Declaration::STRUCT:
              case Declaration::INTERFACE:
                break;

              default:
                param.addError(errorReporter,
                    "Sorry, only pointer types can be used as generic parameters.");
                break;
            }
          }
        }
      }

      return kj::refcounted<BrandScope>(*this, kj::mv(params));
    }
  }